

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O2

node_type * __thiscall Tree<NULLC::Range>::right_rotate(Tree<NULLC::Range> *this,node_type *y)

{
  node_type *pnVar1;
  node<NULLC::Range> *pnVar2;
  int iVar3;
  int iVar4;
  
  pnVar1 = y->left;
  pnVar2 = pnVar1->right;
  pnVar1->right = y;
  y->left = pnVar2;
  iVar3 = 0;
  iVar4 = 0;
  if (pnVar2 != (node<NULLC::Range> *)0x0) {
    iVar4 = pnVar2->height;
  }
  if (y->right != (node<NULLC::Range> *)0x0) {
    iVar3 = y->right->height;
  }
  if (iVar3 < iVar4) {
    iVar3 = iVar4;
  }
  iVar3 = iVar3 + 1;
  y->height = iVar3;
  if (pnVar1->left == (node<NULLC::Range> *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = pnVar1->left->height;
  }
  if (iVar3 < iVar4) {
    iVar3 = iVar4;
  }
  pnVar1->height = iVar3 + 1;
  return pnVar1;
}

Assistant:

node_type* right_rotate(node_type* y)
	{
		node_type *x = y->left;
		node_type *T2 = x->right;

		x->right = y;
		y->left = T2;

		y->height = detail::max(get_height(y->left), get_height(y->right)) + 1;
		x->height = detail::max(get_height(x->left), get_height(x->right)) + 1;

		return x;
	}